

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

bool __thiscall IR::ListOpnd::IsEqualInternal(ListOpnd *this,Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  ListOpnd *this_00;
  ListOpndType *this_01;
  ListOpndType *opnd_00;
  int local_2c;
  int i;
  ListOpnd *l2;
  Opnd *opnd_local;
  ListOpnd *this_local;
  
  if ((this->super_Opnd).m_kind != OpndKindList) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x94d,"(m_kind == OpndKindList)","m_kind == OpndKindList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = Opnd::IsListOpnd(opnd);
  if (bVar2) {
    this_00 = Opnd::AsListOpnd(opnd);
    iVar3 = Count(this_00);
    iVar4 = Count(this);
    if (iVar3 == iVar4) {
      for (local_2c = 0; iVar3 = Count(this), local_2c < iVar3; local_2c = local_2c + 1) {
        this_01 = Item(this,local_2c);
        opnd_00 = Item(this_00,local_2c);
        bVar2 = Opnd::IsEqual(&this_01->super_Opnd,&opnd_00->super_Opnd);
        if (!bVar2) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ListOpnd::IsEqualInternal(Opnd * opnd)
{
    Assert(m_kind == OpndKindList);
    if (!opnd->IsListOpnd())
    {
        return false;
    }
    ListOpnd* l2 = opnd->AsListOpnd();
    if (l2->Count() != Count())
    {
        return false;
    }
    for (int i = 0; i < Count(); ++i)
    {
        if (!Item(i)->IsEqual(l2->Item(i)))
        {
            return false;
        }
    }
    return true;
}